

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::CreateCurve(vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                  *__return_storage_ptr__,Transform *renderFromObject,Transform *objectFromRender,
                 bool reverseOrientation,span<const_pbrt::Point3<float>_> c,Float w0,Float w1,
                 CurveType type,span<const_pbrt::Normal3<float>_> norm,int splitDepth,
                 Allocator alloc)

{
  undefined8 uVar1;
  long lVar2;
  ShapeHandle *pSVar3;
  CurveCommon *pCVar4;
  Curve *pCVar5;
  uint uVar6;
  Float *pFVar7;
  ulong uVar8;
  ulong uVar9;
  size_t count;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool reverseOrientation_local;
  Float w1_local;
  Float w0_local;
  polymorphic_allocator<pbrt::ShapeHandle> local_58;
  Transform *objectFromRender_local;
  Transform *renderFromObject_local;
  Allocator alloc_local;
  span<const_pbrt::Point3<float>_> c_local;
  
  c_local.n = c.n;
  c_local.ptr = c.ptr;
  alloc_local = alloc;
  reverseOrientation_local = reverseOrientation;
  w1_local = w1;
  w0_local = w0;
  objectFromRender_local = objectFromRender;
  renderFromObject_local = renderFromObject;
  pCVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::CurveCommon,pstd::span<pbrt::Point3<float>const>&,float&,float&,pbrt::CurveType&,pstd::span<pbrt::Normal3<float>const>&,pbrt::Transform_const*&,pbrt::Transform_const*&,bool&>
                     (&alloc_local,&c_local,&w0_local,&w1_local,&type,&norm,&renderFromObject_local,
                      &objectFromRender_local,&reverseOrientation_local);
  uVar6 = 1 << (splitDepth & 0x1fU);
  count = (size_t)(int)uVar6;
  local_58.memoryResource = alloc_local.memoryResource;
  pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::vector
            (__return_storage_ptr__,count,&local_58);
  pCVar5 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::Curve>
                     (&alloc_local,count);
  lVar2 = *(long *)(in_FS_OFFSET + -0x3f0);
  auVar11._0_4_ = (float)(int)uVar6;
  pSVar3 = __return_storage_ptr__->ptr;
  pFVar7 = &pCVar5->uMin;
  auVar11._4_4_ = auVar11._0_4_;
  auVar11._8_4_ = auVar11._0_4_;
  auVar11._12_4_ = auVar11._0_4_;
  uVar8 = 0;
  while ((~((int)uVar6 >> 0x1f) & uVar6) != uVar8) {
    uVar9 = (ulong)pCVar5 | 0x6000000000000;
    ((Curve *)(pFVar7 + -2))->common = pCVar4;
    pCVar5 = pCVar5 + 1;
    auVar10 = vpinsrd_avx(ZEXT416((uint)uVar8),(int)(uVar8 + 1),1);
    auVar10 = vcvtudq2ps_avx512vl(auVar10);
    auVar10 = vdivps_avx(auVar10,auVar11);
    uVar1 = vmovlps_avx(auVar10);
    *(undefined8 *)pFVar7 = uVar1;
    pSVar3[uVar8].
    super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
    .bits = uVar9;
    pFVar7 = pFVar7 + 4;
    *(ulong *)(in_FS_OFFSET + -0x3f0) = uVar8 + lVar2 + 1;
    uVar8 = uVar8 + 1;
  }
  *(size_t *)(in_FS_OFFSET + -1000) = count * 0x10 + 0x78 + *(long *)(in_FS_OFFSET + -1000);
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<ShapeHandle> CreateCurve(const Transform *renderFromObject,
                                      const Transform *objectFromRender,
                                      bool reverseOrientation,
                                      pstd::span<const Point3f> c, Float w0, Float w1,
                                      CurveType type, pstd::span<const Normal3f> norm,
                                      int splitDepth, Allocator alloc) {
    CurveCommon *common = alloc.new_object<CurveCommon>(
        c, w0, w1, type, norm, renderFromObject, objectFromRender, reverseOrientation);

    const int nSegments = 1 << splitDepth;
    pstd::vector<ShapeHandle> segments(nSegments, alloc);
    Curve *curves = alloc.allocate_object<Curve>(nSegments);
    for (int i = 0; i < nSegments; ++i) {
        Float uMin = i / (Float)nSegments;
        Float uMax = (i + 1) / (Float)nSegments;
        alloc.construct(&curves[i], common, uMin, uMax);
        segments[i] = &curves[i];
        ++nSplitCurves;
    }

    curveBytes += sizeof(CurveCommon) + nSegments * sizeof(Curve);
    return segments;
}